

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall SocketInternals::ExtractInterfaceInfo(SocketInternals *this,MsgHeaderType *hdr)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int *piVar4;
  void *local_160;
  char local_150 [8];
  ifreq ifr;
  char ifName [256];
  CMsgHdrType *cmsg;
  MsgHeaderType *hdr_local;
  SocketInternals *this_local;
  
  this->InterfaceIndex = -1;
  if (hdr->msg_controllen < 0x10) {
    local_160 = (void *)0x0;
  }
  else {
    local_160 = hdr->msg_control;
  }
  for (ifName._248_8_ = local_160; ifName._248_8_ != 0;
      ifName._248_8_ = __cmsg_nxthdr((msghdr *)hdr,(cmsghdr *)ifName._248_8_)) {
    if ((*(int *)(ifName._248_8_ + 8) == 0) && (*(int *)(ifName._248_8_ + 0xc) == 8)) {
      this->InterfaceIndex = *(int *)(ifName._248_8_ + 0x10);
    }
  }
  pcVar2 = if_indextoname(this->InterfaceIndex,ifr.ifr_ifru.ifru_slave + 0x10);
  if (pcVar2 == (char *)0x0) {
    poVar3 = std::operator<<(this->outStr,"Recv: failed if_indextoname: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::operator=((string *)&this->InterfaceName,ifr.ifr_ifru.ifru_slave + 0x10);
    memset(local_150,0,0x28);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strcpy(local_150,pcVar2);
    iVar1 = ioctl(this->SocketFD,0x8921,local_150);
    if (iVar1 == 0) {
      this->InterfaceMTU = ifr.ifr_ifrn._8_4_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SocketInternals::ExtractInterfaceInfo(MsgHeaderType *hdr)
{
    InterfaceIndex = -1;
    // iterate through all the control headers
    for (CMsgHdrType * cmsg = CMSG_FIRSTHDR(hdr);
         cmsg != NULL;
         cmsg = CMSG_NXTHDR(hdr, cmsg)) {
        // ignore the control headers that don't match what we want
        if (cmsg->cmsg_level != IPPROTO_IP ||
            cmsg->cmsg_type != IP_PKTINFO) {
            continue;
        }
        // struct in_pktinfo * pi = CMSG_DATA(cmsg)->ipi;
        // at this point, peeraddr is the source sockaddr
        // pi->ipi_spec_dst is the destination in_addr
        InterfaceIndex = ((struct in_pktinfo*)CMSG_DATA(cmsg))->ipi_ifindex;
    }

    // should check if index != -1

#ifdef _MSC_VER
    // Windows supports if_indextoname, but the name returned does not appear to be
    // meaningful. Also, Windows does not appear to support ioctl (or WSAIoctl) to
    // query the MTU value. Thus, we instead use GetAdaptersAddresses, which gives us
    // both the InterfaceName and InterfaceMTU for the specified InterfaceIndex.
    //
    // We first call GetAdaptersAddresses with a null buffer to query the required buffer size.
    PIP_ADAPTER_ADDRESSES addrList = 0;
    ULONG bufSize = 0;
    ULONG retval;
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval != ERROR_BUFFER_OVERFLOW) {
        outStr << "Recv: GetAdaptersAddresses failed to return buffer size" << std::endl;
        return false;
    }
    // Now, bufSize indicates the correct buffer size. Allocate memory and then call
    // GetAdaptersAddresses again to get the information.
    char *buffer = new char[bufSize];
    addrList = reinterpret_cast<PIP_ADAPTER_ADDRESSES>(buffer);
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval == NO_ERROR) {
        for (PIP_ADAPTER_ADDRESSES addr = addrList;  addr != 0; addr = addr->Next) {
            if (addr->IfIndex == InterfaceIndex) {
                char fname[256];  // Should be large enough
                if (WideCharToMultiByte(CP_ACP, 0, addr->FriendlyName, -1, fname, sizeof(fname), NULL, NULL) > 0) {
                        InterfaceName = fname;
                        InterfaceMTU = addr->Mtu;
                        break;
                }
            }
        }
    }
    delete [] buffer;
#else
    // get interface name and MTU
    char ifName[256];
    if (if_indextoname(InterfaceIndex, ifName) == NULL) {
        outStr << "Recv: failed if_indextoname: " << strerror(errno) << std::endl;
        return false;
    }
    InterfaceName = ifName;

    struct ifreq ifr;
    memset(&ifr, 0, sizeof(ifr));
    strcpy(ifr.ifr_name, InterfaceName.c_str());
    if (!ioctl(SocketFD, SIOCGIFMTU, &ifr)) {
        InterfaceMTU = ifr.ifr_mtu;
        return true;
    }
#endif
    return false;
}